

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O0

void Gia_ManInsertState(Gia_ManEra_t *p,Gia_ObjEra_t *pState)

{
  Gia_Man_t *p_00;
  int iVar1;
  uint *__s;
  bool bVar2;
  int local_2c;
  int i;
  uint *pSimInfo;
  Gia_Obj_t *pObj;
  Gia_ObjEra_t *pState_local;
  Gia_ManEra_t *p_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p->pAig);
    bVar2 = false;
    if (local_2c < iVar1) {
      p_00 = p->pAig;
      iVar1 = Gia_ManPiNum(p->pAig);
      pSimInfo = (uint *)Gia_ManCi(p_00,iVar1 + local_2c);
      bVar2 = (Gia_Obj_t *)pSimInfo != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjId(p->pAig,(Gia_Obj_t *)pSimInfo);
    __s = Gia_ManEraData(p,iVar1);
    iVar1 = Abc_InfoHasBit((uint *)(pState + 1),local_2c);
    if (iVar1 == 0) {
      memset(__s,0,(long)p->nWordsSim << 2);
    }
    else {
      memset(__s,0xff,(long)p->nWordsSim << 2);
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Gia_ManInsertState( Gia_ManEra_t * p, Gia_ObjEra_t * pState )
{
    Gia_Obj_t * pObj;
    unsigned * pSimInfo;
    int i;
    Gia_ManForEachRo( p->pAig, pObj, i )
    {
        pSimInfo = Gia_ManEraData( p, Gia_ObjId(p->pAig, pObj) );
        if ( Abc_InfoHasBit(pState->pData, i) )
            memset( pSimInfo, 0xff, sizeof(unsigned) * p->nWordsSim );
        else
            memset( pSimInfo, 0, sizeof(unsigned) * p->nWordsSim );
    }
}